

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O1

void __thiscall
TEST_TestHarness_c_checkIntText_Test::~TEST_TestHarness_c_checkIntText_Test
          (TEST_TestHarness_c_checkIntText_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkIntText)
{
    CHECK_EQUAL_C_INT_TEXT(2, 2, "Text");
    fixture->setTestFunction(failIntTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: IntTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}